

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  pvVar1 = &(this->super_IfcReinforcingElement).field_0x178 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x178) = 0x8b5938;
  *(undefined8 *)((long)pvVar1 + 0x78) = 0x8b5a78;
  *(undefined8 *)((long)pvVar1 + -0xf0) = 0x8b5960;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8b5988;
  *(undefined8 *)((long)pvVar1 + -0xa8) = 0x8b59b0;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x8b59d8;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x8b5a00;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x8b5a28;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8b5a50;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                     super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                     field_0x0 + lVar2),&PTR_construction_vtable_24__008b5700);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}